

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

Option * ncnn::get_masked_option(Option *__return_storage_ptr__,Option *opt,int featmask)

{
  ulong uVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  Allocator *pAVar10;
  Allocator *pAVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  int iVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  undefined3 uVar44;
  int iVar45;
  byte bVar46;
  bool bVar47;
  int iVar48;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar49 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  
  bVar43 = opt->lightmode;
  uVar44 = *(undefined3 *)&opt->field_0x1;
  iVar45 = opt->num_threads;
  pAVar10 = opt->blob_allocator;
  pAVar11 = opt->workspace_allocator;
  iVar48 = opt->openmp_blocktime;
  bVar26 = opt->use_winograd_convolution;
  bVar27 = opt->use_sgemm_convolution;
  bVar28 = opt->use_int8_inference;
  bVar29 = opt->use_vulkan_compute;
  bVar47 = opt->use_fp16_packed;
  bVar12 = opt->use_fp16_storage;
  bVar13 = opt->use_fp16_arithmetic;
  bVar14 = opt->use_int8_packed;
  bVar15 = opt->use_int8_storage;
  bVar16 = opt->use_int8_arithmetic;
  bVar17 = opt->use_packing_layout;
  bVar18 = opt->use_shader_pack8;
  bVar19 = opt->use_subgroup_basic;
  bVar20 = opt->use_subgroup_vote;
  bVar21 = opt->use_subgroup_ballot;
  bVar22 = opt->use_subgroup_shuffle;
  bVar23 = opt->use_image_storage;
  bVar24 = opt->use_tensor_storage;
  bVar25 = opt->use_reserved_0;
  iVar30 = opt->flush_denormals;
  bVar31 = opt->use_local_pool_allocator;
  bVar32 = opt->use_shader_local_memory;
  bVar33 = opt->use_cooperative_matrix;
  bVar34 = opt->use_winograd23_convolution;
  bVar35 = opt->use_winograd43_convolution;
  bVar36 = opt->use_winograd63_convolution;
  bVar37 = opt->use_a53_a55_optimized_kernel;
  bVar38 = opt->use_reserved_7;
  bVar39 = opt->use_reserved_8;
  bVar40 = opt->use_reserved_9;
  bVar41 = opt->use_reserved_10;
  bVar42 = opt->use_reserved_11;
  __return_storage_ptr__->use_bf16_storage = opt->use_bf16_storage;
  __return_storage_ptr__->use_fp16_packed = bVar47;
  __return_storage_ptr__->use_fp16_storage = bVar12;
  __return_storage_ptr__->use_fp16_arithmetic = bVar13;
  __return_storage_ptr__->use_int8_packed = bVar14;
  __return_storage_ptr__->use_int8_storage = bVar15;
  __return_storage_ptr__->use_int8_arithmetic = bVar16;
  __return_storage_ptr__->use_packing_layout = bVar17;
  __return_storage_ptr__->use_shader_pack8 = bVar18;
  __return_storage_ptr__->use_subgroup_basic = bVar19;
  __return_storage_ptr__->use_subgroup_vote = bVar20;
  __return_storage_ptr__->use_subgroup_ballot = bVar21;
  __return_storage_ptr__->use_subgroup_shuffle = bVar22;
  __return_storage_ptr__->use_image_storage = bVar23;
  __return_storage_ptr__->use_tensor_storage = bVar24;
  __return_storage_ptr__->use_reserved_0 = bVar25;
  __return_storage_ptr__->workspace_allocator = pAVar11;
  __return_storage_ptr__->openmp_blocktime = iVar48;
  __return_storage_ptr__->use_winograd_convolution = bVar26;
  __return_storage_ptr__->use_sgemm_convolution = bVar27;
  __return_storage_ptr__->use_int8_inference = bVar28;
  __return_storage_ptr__->use_vulkan_compute = bVar29;
  __return_storage_ptr__->flush_denormals = iVar30;
  __return_storage_ptr__->use_local_pool_allocator = bVar31;
  __return_storage_ptr__->use_shader_local_memory = bVar32;
  __return_storage_ptr__->use_cooperative_matrix = bVar33;
  __return_storage_ptr__->use_winograd23_convolution = bVar34;
  __return_storage_ptr__->use_winograd43_convolution = bVar35;
  __return_storage_ptr__->use_winograd63_convolution = bVar36;
  __return_storage_ptr__->use_a53_a55_optimized_kernel = bVar37;
  __return_storage_ptr__->use_reserved_7 = bVar38;
  __return_storage_ptr__->use_reserved_8 = bVar39;
  __return_storage_ptr__->use_reserved_9 = bVar40;
  __return_storage_ptr__->use_reserved_10 = bVar41;
  __return_storage_ptr__->use_reserved_11 = bVar42;
  __return_storage_ptr__->lightmode = bVar43;
  *(undefined3 *)&__return_storage_ptr__->field_0x1 = uVar44;
  __return_storage_ptr__->num_threads = iVar45;
  __return_storage_ptr__->blob_allocator = pAVar10;
  iVar48 = -(uint)((featmask & 0x10U) == 0);
  auVar49._0_8_ = CONCAT44(-(uint)((featmask & 4U) == 0),iVar48);
  auVar49._8_4_ = 0xffffffff;
  auVar49._12_4_ = 0xffffffff;
  uVar1._0_1_ = __return_storage_ptr__->use_vulkan_compute;
  uVar1._1_1_ = __return_storage_ptr__->use_bf16_storage;
  uVar1._2_1_ = __return_storage_ptr__->use_fp16_packed;
  uVar1._3_1_ = __return_storage_ptr__->use_fp16_storage;
  uVar1._4_1_ = __return_storage_ptr__->use_fp16_arithmetic;
  uVar1._5_1_ = __return_storage_ptr__->use_int8_packed;
  uVar1._6_1_ = __return_storage_ptr__->use_int8_storage;
  uVar1._7_1_ = __return_storage_ptr__->use_int8_arithmetic;
  auVar58._8_6_ = 0;
  auVar58._0_8_ = uVar1;
  auVar58[0xe] = uVar1._7_1_;
  auVar58[0xf] = uVar1._7_1_;
  auVar57._14_2_ = auVar58._14_2_;
  auVar57._8_5_ = 0;
  auVar57._0_8_ = uVar1;
  auVar57[0xd] = uVar1._6_1_;
  auVar56._13_3_ = auVar57._13_3_;
  auVar56._8_4_ = 0;
  auVar56._0_8_ = uVar1;
  auVar56[0xc] = uVar1._6_1_;
  auVar55._12_4_ = auVar56._12_4_;
  auVar55._8_3_ = 0;
  auVar55._0_8_ = uVar1;
  auVar55[0xb] = uVar1._5_1_;
  auVar54._11_5_ = auVar55._11_5_;
  auVar54._8_2_ = 0;
  auVar54._0_8_ = uVar1;
  auVar54[10] = uVar1._5_1_;
  auVar53._10_6_ = auVar54._10_6_;
  auVar53[8] = 0;
  auVar53._0_8_ = uVar1;
  auVar53[9] = uVar1._4_1_;
  auVar52._9_7_ = auVar53._9_7_;
  auVar52[8] = uVar1._4_1_;
  auVar52._0_8_ = uVar1;
  auVar51._8_8_ = auVar52._8_8_;
  auVar51[7] = uVar1._3_1_;
  auVar51[6] = uVar1._3_1_;
  auVar51[5] = uVar1._2_1_;
  auVar51[4] = uVar1._2_1_;
  auVar51[3] = uVar1._1_1_;
  auVar51[2] = uVar1._1_1_;
  auVar51[1] = (undefined1)uVar1;
  auVar51[0] = (undefined1)uVar1;
  auVar59 = pshuflw(in_XMM4,auVar49,0xe8);
  auVar60._8_8_ = auVar59._8_8_;
  auVar60._0_8_ = auVar59._0_8_ & 0xffff0000ffffffff | (ulong)((featmask & 2U) == 0) << 0x20;
  auVar59._0_4_ = -(uint)((featmask & 1U) == 0);
  auVar59._4_4_ = -(uint)((featmask & 8U) == 0);
  auVar59._8_4_ = -(uint)((featmask & 8U) == 0);
  auVar59._12_4_ = -(uint)((featmask & 8U) == 0);
  auVar59 = pshuflw(auVar59,auVar59,0xa8);
  auVar50 = pshuflw((undefined1  [16])0x0,auVar60,0xa4);
  auVar50._8_8_ = auVar59._0_8_;
  auVar59 = auVar50 & auVar51 & _DAT_00554410;
  sVar2 = auVar59._0_2_;
  sVar3 = auVar59._2_2_;
  sVar4 = auVar59._4_2_;
  sVar5 = auVar59._6_2_;
  sVar6 = auVar59._8_2_;
  sVar7 = auVar59._10_2_;
  sVar8 = auVar59._12_2_;
  sVar9 = auVar59._14_2_;
  __return_storage_ptr__->use_vulkan_compute =
       (bool)((0 < sVar2) * (sVar2 < 0x100) * auVar59[0] - (0xff < sVar2));
  __return_storage_ptr__->use_bf16_storage =
       (bool)((0 < sVar3) * (sVar3 < 0x100) * auVar59[2] - (0xff < sVar3));
  __return_storage_ptr__->use_fp16_packed =
       (bool)((0 < sVar4) * (sVar4 < 0x100) * auVar59[4] - (0xff < sVar4));
  __return_storage_ptr__->use_fp16_storage =
       (bool)((0 < sVar5) * (sVar5 < 0x100) * auVar59[6] - (0xff < sVar5));
  __return_storage_ptr__->use_fp16_arithmetic =
       (bool)((0 < sVar6) * (sVar6 < 0x100) * auVar59[8] - (0xff < sVar6));
  __return_storage_ptr__->use_int8_packed =
       (bool)((0 < sVar7) * (sVar7 < 0x100) * auVar59[10] - (0xff < sVar7));
  __return_storage_ptr__->use_int8_storage =
       (bool)((0 < sVar8) * (sVar8 < 0x100) * auVar59[0xc] - (0xff < sVar8));
  __return_storage_ptr__->use_int8_arithmetic =
       (bool)((0 < sVar9) * (sVar9 < 0x100) * auVar59[0xe] - (0xff < sVar9));
  bVar46 = (byte)iVar48;
  __return_storage_ptr__->use_image_storage =
       (bool)(__return_storage_ptr__->use_image_storage & bVar46);
  __return_storage_ptr__->use_tensor_storage =
       (bool)(__return_storage_ptr__->use_tensor_storage & bVar46);
  __return_storage_ptr__->use_sgemm_convolution =
       (bool)(__return_storage_ptr__->use_sgemm_convolution & (featmask & 0x20U) == 0);
  bVar47 = (featmask & 0x40U) == 0;
  __return_storage_ptr__->use_winograd_convolution =
       (bool)(__return_storage_ptr__->use_winograd_convolution & bVar47);
  return (Option *)CONCAT71((int7)((ulong)auVar49._0_8_ >> 8),bVar47);
}

Assistant:

static Option get_masked_option(const Option& opt, int featmask)
{
    // mask option usage as layer specific featmask
    Option opt1 = opt;
    opt1.use_fp16_arithmetic = opt1.use_fp16_arithmetic && !(featmask & (1 << 0));
    opt1.use_fp16_storage = opt1.use_fp16_storage && !(featmask & (1 << 1));
    opt1.use_fp16_packed = opt1.use_fp16_packed && !(featmask & (1 << 1));
    opt1.use_bf16_storage = opt1.use_bf16_storage && !(featmask & (1 << 2));
    opt1.use_int8_packed = opt1.use_int8_packed && !(featmask & (1 << 3));
    opt1.use_int8_storage = opt1.use_int8_storage && !(featmask & (1 << 3));
    opt1.use_int8_arithmetic = opt1.use_int8_arithmetic && !(featmask & (1 << 3));
    opt1.use_vulkan_compute = opt1.use_vulkan_compute && !(featmask & (1 << 4));
    opt1.use_image_storage = opt1.use_image_storage && !(featmask & (1 << 4));
    opt1.use_tensor_storage = opt1.use_tensor_storage && !(featmask & (1 << 4));
    opt1.use_sgemm_convolution = opt1.use_sgemm_convolution && !(featmask & (1 << 5));
    opt1.use_winograd_convolution = opt1.use_winograd_convolution && !(featmask & (1 << 6));

    return opt1;
}